

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StartRoom.cpp
# Opt level: O1

void __thiscall StartRoom::StartRoom(StartRoom *this,string *rn,ItemTable *iList,bool sld)

{
  long *plVar1;
  long *plVar2;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  long *local_48;
  long local_40;
  long local_38;
  long lStack_30;
  
  Room::Room(&this->super_Room);
  (this->super_Room)._vptr_Room = (_func_int **)&PTR_getDescription_abi_cxx11__00135190;
  (this->super_Room).table = iList;
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,
             "/workspace/llm4binary/github/license_all_cmakelists_25/originalname51[P]adventure_game/RoomDescriptions/"
             ,"");
  plVar1 = (long *)std::__cxx11::string::_M_append((char *)local_68,(ulong)(rn->_M_dataplus)._M_p);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_38 = *plVar2;
    lStack_30 = plVar1[3];
    local_48 = &local_38;
  }
  else {
    local_38 = *plVar2;
    local_48 = (long *)*plVar1;
  }
  local_40 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::operator=((string *)&(this->super_Room).roomName,(string *)&local_48);
  if (local_48 != &local_38) {
    operator_delete(local_48);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  (this->super_Room).showLongDescription = sld;
  Room::parseData(&this->super_Room);
  return;
}

Assistant:

StartRoom::StartRoom(std::string rn, ItemTable *iList, bool sld) {
    table = iList;
    roomName = std::string(RESOURCES_PATH) + rn;
    showLongDescription = sld;
    parseData();

}